

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_scrollarea.cpp
# Opt level: O2

void QtMWidgets::ScrollArea::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Int *pIVar1;
  bool bVar2;
  Alignment AVar3;
  
  if (_c == WriteProperty) {
    if (_id == 1) {
      setAlignment((ScrollArea *)_o,(Alignment)**_a);
      return;
    }
    if (_id == 0) {
      setWidgetResizable((ScrollArea *)_o,SUB41(**_a,0));
      return;
    }
  }
  else if (_c == ReadProperty) {
    pIVar1 = (Int *)*_a;
    if (_id == 1) {
      AVar3 = alignment((ScrollArea *)_o);
      *pIVar1 = AVar3.i;
    }
    else if (_id == 0) {
      bVar2 = widgetResizable((ScrollArea *)_o);
      *(bool *)pIVar1 = bVar2;
    }
  }
  return;
}

Assistant:

void QtMWidgets::ScrollArea::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<ScrollArea *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->widgetResizable(); break;
        case 1: *reinterpret_cast< Qt::Alignment*>(_v) = _t->alignment(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<ScrollArea *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWidgetResizable(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setAlignment(*reinterpret_cast< Qt::Alignment*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}